

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  CURLM *multi;
  long lVar2;
  char *__s;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    test_cold_1();
    goto LAB_00102785;
  }
  multi = (CURLM *)curl_multi_init();
  if (multi == (CURLM *)0x0) {
    test_cold_11();
    iVar1 = 0x7b;
LAB_001027c2:
    lVar2 = 0;
  }
  else {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      test_cold_10();
      iVar1 = 0x7c;
      goto LAB_001027c2;
    }
    iVar1 = curl_multi_setopt(multi,3,1);
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar2,0x4e2b,fwrite);
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar2,0x2d,1);
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
          if (iVar1 == 0) {
            iVar1 = curl_multi_add_handle(multi,lVar2);
            if (iVar1 == 0) {
              iVar1 = perform(multi);
              if (iVar1 == 0) {
                curl_multi_remove_handle(multi,lVar2);
                curl_easy_reset(lVar2);
                iVar1 = curl_easy_setopt(lVar2,0x2d,1);
                if (iVar1 == 0) {
                  iVar1 = curl_easy_setopt(lVar2,0x2712,libtest_arg2);
                  if (iVar1 == 0) {
                    iVar1 = curl_multi_add_handle(multi,lVar2);
                    if (iVar1 == 0) {
                      iVar1 = perform(multi);
                      if (iVar1 != 0) {
                        __s = "retrieve 2 failed";
                        goto LAB_0010275f;
                      }
                      curl_multi_remove_handle(multi,lVar2);
                      iVar1 = 0;
                    }
                    else {
                      test_cold_9();
                    }
                  }
                  else {
                    test_cold_8();
                  }
                }
                else {
                  test_cold_7();
                }
              }
              else {
                __s = "retrieve 1 failed";
LAB_0010275f:
                puts(__s);
              }
            }
            else {
              test_cold_6();
            }
          }
          else {
            test_cold_5();
          }
        }
        else {
          test_cold_4();
        }
      }
      else {
        test_cold_3();
      }
    }
    else {
      test_cold_2();
    }
  }
  curl_easy_cleanup(lVar2);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
  puts("Finished!");
LAB_00102785:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  CURL *easy = NULL;
  int res = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(easy);

  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);

  easy_setopt(easy, CURLOPT_WRITEFUNCTION, fwrite);
  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, URL);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 1 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

  curl_easy_reset(easy);

  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, libtest_arg2);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 2 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 2 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();

  printf("Finished!\n");

  return res;
}